

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O1

void i_number_suite::i_number_very_big_negative_int(void)

{
  reader reader;
  char input [50];
  undefined4 local_1b4;
  view_type local_1b0 [2];
  basic_reader<char> local_190;
  char local_48 [56];
  
  builtin_strncpy(local_48,"-237462374673276894279832749832423479823246327846",0x32);
  local_1b0[0]._M_len = strlen(local_48);
  local_1b0[0]._M_str = local_48;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_190,local_1b0);
  local_1b0[0]._M_len = CONCAT44(local_1b0[0]._M_len._4_4_,local_190.decoder.current.code);
  local_1b4 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x77,"void i_number_suite::i_number_very_big_negative_int()",local_1b0,&local_1b4);
  local_1b0[0]._M_len =
       (long)local_190.decoder.current.view.tail - (long)local_190.decoder.current.view.head;
  local_1b0[0]._M_str = local_190.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[50]>
            ("reader.literal()","\"-237462374673276894279832749832423479823246327846\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x78,"void i_number_suite::i_number_very_big_negative_int()",local_1b0,
             "-237462374673276894279832749832423479823246327846");
  trial::protocol::json::basic_reader<char>::value<long_long>(&local_190);
  boost::detail::throw_failed_impl
            ("reader.value<long long int>()","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x7c,"void i_number_suite::i_number_very_big_negative_int()");
  if (local_190.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_190.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void i_number_very_big_negative_int()
{
    const char input[] = "-237462374673276894279832749832423479823246327846";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "-237462374673276894279832749832423479823246327846");
    // Cannot be represented by integers
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<long long int>(),
                                    json::error,
                                    "invalid value");
}